

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sorted_block.cpp
# Opt level: O2

unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true> __thiscall
duckdb::SortedData::CreateSlice
          (SortedData *this,idx_t start_block_index,idx_t end_block_index,idx_t end_entry_index)

{
  pointer pSVar1;
  reference pvVar2;
  pointer pRVar3;
  size_type __n;
  idx_t in_R8;
  shared_ptr<duckdb::BlockHandle,_true> local_58;
  vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
  *local_48;
  idx_t local_40;
  idx_t local_38;
  
  local_40 = in_R8;
  make_uniq<duckdb::SortedData,duckdb::SortedDataType_const&,duckdb::RowLayout_const&,duckdb::BufferManager&,duckdb::GlobalSortState&>
            ((duckdb *)this,(SortedDataType *)start_block_index,(RowLayout *)(start_block_index + 8)
             ,*(BufferManager **)(start_block_index + 0x98),
             *(GlobalSortState **)(start_block_index + 0xa0));
  local_48 = (vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
              *)(start_block_index + 0x78);
  local_38 = end_block_index;
  for (; end_block_index <= end_entry_index; end_block_index = end_block_index + 1) {
    pSVar1 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
             operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                         *)this);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                          *)(start_block_index + 0x60),end_block_index);
    unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::operator->
              (pvVar2);
    RowDataBlock::Copy((RowDataBlock *)&local_58);
    ::std::
    vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
    ::
    emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
              ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                *)&pSVar1->data_blocks,
               (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *)
               &local_58);
    ::std::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>::~unique_ptr
              ((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> *)
               &local_58);
    if ((*(char *)(start_block_index + 0x50) == '\0') &&
       (*(char *)(*(long *)(start_block_index + 0xa0) + 0x290) == '\x01')) {
      pSVar1 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
               operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                           *)this);
      pvVar2 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::get<true>(local_48,end_block_index);
      unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::operator->
                (pvVar2);
      RowDataBlock::Copy((RowDataBlock *)&local_58);
      ::std::
      vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
      ::
      emplace_back<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>
                ((vector<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>,std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,std::default_delete<duckdb::RowDataBlock>,true>>>
                  *)&pSVar1->heap_blocks,
                 (unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>
                  *)&local_58);
      ::std::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_>::
      ~unique_ptr((unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>_> *)
                  &local_58);
    }
  }
  for (__n = 0; local_38 != __n; __n = __n + 1) {
    local_58.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    local_58.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    pvVar2 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::get<true>((vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
                          *)(start_block_index + 0x60),__n);
    pRVar3 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar2);
    shared_ptr<duckdb::BlockHandle,_true>::operator=(&pRVar3->block,&local_58);
    ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_58.internal.
                super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if ((*(char *)(start_block_index + 0x50) == '\0') &&
       (*(char *)(*(long *)(start_block_index + 0xa0) + 0x290) == '\x01')) {
      local_58.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_58.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      pvVar2 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
               ::get<true>(local_48,__n);
      pRVar3 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(pvVar2);
      shared_ptr<duckdb::BlockHandle,_true>::operator=(&pRVar3->block,&local_58);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_58.internal.
                  super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
  }
  pSVar1 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator->
                     ((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                       *)this);
  pvVar2 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
           ::back(&pSVar1->data_blocks);
  pRVar3 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
           operator->(pvVar2);
  pRVar3->count = local_40;
  if ((*(char *)(start_block_index + 0x50) == '\0') &&
     (*(char *)(*(long *)(start_block_index + 0xa0) + 0x290) == '\x01')) {
    pSVar1 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::
             operator->((unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                         *)this);
    pvVar2 = vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_true>
             ::back(&pSVar1->heap_blocks);
    pRVar3 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
             operator->(pvVar2);
    pRVar3->count = local_40;
  }
  return (unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>)
         (unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>_>)this;
}

Assistant:

unique_ptr<SortedData> SortedData::CreateSlice(idx_t start_block_index, idx_t end_block_index, idx_t end_entry_index) {
	// Add the corresponding blocks to the result
	auto result = make_uniq<SortedData>(type, layout, buffer_manager, state);
	for (idx_t i = start_block_index; i <= end_block_index; i++) {
		result->data_blocks.push_back(data_blocks[i]->Copy());
		if (!layout.AllConstant() && state.external) {
			result->heap_blocks.push_back(heap_blocks[i]->Copy());
		}
	}
	// All of the blocks that come before block with idx = start_block_idx can be reset (other references exist)
	for (idx_t i = 0; i < start_block_index; i++) {
		data_blocks[i]->block = nullptr;
		if (!layout.AllConstant() && state.external) {
			heap_blocks[i]->block = nullptr;
		}
	}
	// Use start and end entry indices to set the boundaries
	D_ASSERT(end_entry_index <= result->data_blocks.back()->count);
	result->data_blocks.back()->count = end_entry_index;
	if (!layout.AllConstant() && state.external) {
		result->heap_blocks.back()->count = end_entry_index;
	}
	return result;
}